

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

PClassActor * __thiscall USDFParser::CheckActorType(USDFParser *this,char *key)

{
  int iVar1;
  PClassActor *pPVar2;
  char *name;
  
  iVar1 = (this->super_UDMFParserBase).namespace_bits;
  if (iVar1 == 1) {
    name = UDMFParserBase::CheckString(&this->super_UDMFParserBase,key);
    pPVar2 = PClass::FindActor(name);
    if (pPVar2 == (PClassActor *)0x0) {
      pPVar2 = (PClassActor *)0x0;
      FScanner::ScriptMessage((FScanner *)this,"Unknown actor class \'%s\'",key);
    }
  }
  else {
    if (iVar1 == 2) {
      iVar1 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,key);
      pPVar2 = GetStrifeType(iVar1);
      return pPVar2;
    }
    pPVar2 = (PClassActor *)0x0;
  }
  return pPVar2;
}

Assistant:

PClassActor *CheckActorType(const char *key)
	{
		if (namespace_bits == St)
		{
			return GetStrifeType(CheckInt(key));
		}
		else if (namespace_bits == Zd)
		{
			PClassActor *cls = PClass::FindActor(CheckString(key));
			if (cls == NULL)
			{
				sc.ScriptMessage("Unknown actor class '%s'", key);
				return NULL;
			}
			return cls;
		}
		return NULL;
	}